

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wi_stuff.cpp
# Opt level: O1

void __thiscall FPatchInfo::Init(FPatchInfo *this,FGIFont *gifont)

{
  FTextureID FVar1;
  EColorRange EVar2;
  FFont *pFVar3;
  FTexture *pFVar4;
  FPatchInfo *pFVar5;
  FName local_1c;
  
  if ((gifont->color).Index == 1) {
    FVar1 = FTextureManager::GetTexture
                      (&TexMan,FName::NameData.NameArray[(gifont->fontname).Index].Text,8,0);
    if (FVar1.texnum < 0) {
      pFVar4 = (FTexture *)0x0;
    }
    else {
      pFVar4 = TexMan.Textures.Array[(uint)FVar1.texnum].Texture;
    }
    this->mPatch = pFVar4;
    this->mColor = -(uint)(pFVar4 != (FTexture *)0x0) | CR_UNTRANSLATED;
    pFVar5 = this;
  }
  else {
    pFVar3 = V_GetFont(FName::NameData.NameArray[(gifont->fontname).Index].Text);
    this->mFont = pFVar3;
    local_1c.Index = (gifont->color).Index;
    EVar2 = V_FindFontColor(&local_1c);
    this->mColor = EVar2;
    pFVar5 = (FPatchInfo *)&this->mPatch;
  }
  pFVar5->mFont = (FFont *)0x0;
  if (this->mFont == (FFont *)0x0) {
    this->mFont = BigFont;
  }
  return;
}

Assistant:

void Init(FGIFont &gifont)
	{
		if (gifont.color == NAME_Null)
		{
			mPatch = TexMan[gifont.fontname];	// "entering"
			mColor = mPatch == NULL? CR_UNTRANSLATED : CR_UNDEFINED;
			mFont = NULL;
		}
		else
		{
			mFont = V_GetFont(gifont.fontname);
			mColor = V_FindFontColor(gifont.color);
			mPatch = NULL;
		}
		if (mFont == NULL)
		{
			mFont = BigFont;
		}
	}